

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkTypeUtil.hpp
# Opt level: O0

VkClearValue vk::makeClearValueColorF32(float r,float g,float b,float a)

{
  VkClearValue VVar1;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  VkClearValue v;
  
  VVar1.depthStencil.stencil = (deUint32)g;
  VVar1.depthStencil.depth = r;
  VVar1._8_4_ = b;
  VVar1._12_4_ = a;
  return VVar1;
}

Assistant:

inline VkClearValue makeClearValueColorF32 (float r, float g, float b, float a)
{
	VkClearValue v;
	v.color.float32[0] = r;
	v.color.float32[1] = g;
	v.color.float32[2] = b;
	v.color.float32[3] = a;
	return v;
}